

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_tests.cpp
# Opt level: O2

void __thiscall key_tests::bip340_test_vectors::test_method(bip340_test_vectors *this)

{
  FastRandomContext *this_00;
  pointer ppVar1;
  pointer paVar2;
  bool bVar3;
  readonly_property<bool> rVar4;
  int iVar5;
  pointer paVar6;
  uint256 *puVar7;
  iterator in_R8;
  iterator pvVar8;
  XOnlyPubKey *in_R9;
  iterator pvVar9;
  uint256 *aux;
  pointer ppVar10;
  long lVar11;
  long in_FS_OFFSET;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  string_view hex_str;
  string_view hex_str_00;
  string_view hex_str_01;
  const_string file;
  Span<const_unsigned_char> vch;
  Span<const_unsigned_char> vch_00;
  string_view hex_str_02;
  string_view hex_str_03;
  string_view hex_str_04;
  Span<const_unsigned_char> vch_01;
  string_view hex_str_05;
  Span<const_unsigned_char> vch_02;
  string_view hex_str_06;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  initializer_list<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>
  __l;
  initializer_list<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>_>
  __l_00;
  Span<const_unsigned_char> sigbytes;
  Span<unsigned_char> sig_00;
  Span<const_unsigned_char> sigbytes_00;
  Span<unsigned_char> sig_01;
  Span<const_unsigned_char> sigbytes_01;
  Span<unsigned_char> sig_02;
  Span<const_unsigned_char> sigbytes_02;
  Span<unsigned_char> sig_03;
  Span<const_unsigned_char> sigbytes_03;
  bool *in_stack_fffffffffffff140;
  char *local_e98;
  char *local_e90;
  undefined1 *local_e88;
  undefined1 *local_e80;
  char *local_e78;
  char *local_e70;
  char *local_e68;
  char *local_e60;
  undefined1 *local_e58;
  undefined1 *local_e50;
  char *local_e48;
  char *local_e40;
  char *local_e38;
  char *local_e30;
  undefined1 *local_e28;
  undefined1 *local_e20;
  char *local_e18;
  char *local_e10;
  char *local_e08;
  char *local_e00;
  undefined1 *local_df8;
  undefined1 *local_df0;
  char *local_de8;
  char *local_de0;
  char *local_dd8;
  char *local_dd0;
  undefined1 *local_dc8;
  undefined1 *local_dc0;
  char *local_db8;
  char *local_db0;
  char *local_da8;
  char *local_da0;
  undefined1 *local_d98;
  undefined1 *local_d90;
  char *local_d88;
  char *local_d80;
  char *local_d78;
  char *local_d70;
  undefined1 *local_d68;
  undefined1 *local_d60;
  char *local_d58;
  char *local_d50;
  char *local_d48;
  char *local_d40;
  undefined1 *local_d38;
  undefined1 *local_d30;
  char *local_d28;
  char *local_d20;
  char *local_d18;
  char *local_d10;
  undefined1 *local_d08;
  undefined1 *local_d00;
  char *local_cf8;
  char *local_cf0;
  char *local_ce8;
  char *local_ce0;
  undefined1 *local_cd8;
  undefined1 *local_cd0;
  char *local_cc8;
  char *local_cc0;
  char *local_cb8;
  char *local_cb0;
  undefined1 *local_ca8;
  undefined1 *local_ca0;
  char *local_c98;
  char *local_c90;
  char *local_c88;
  char *local_c80;
  undefined1 *local_c78;
  undefined1 *local_c70;
  char *local_c68;
  char *local_c60;
  char *local_c58;
  char *local_c50;
  undefined1 *local_c48;
  undefined1 *local_c40;
  char *local_c38;
  char *local_c30;
  allocator_type local_c26;
  allocator<char> local_c25;
  allocator<char> local_c24;
  allocator<char> local_c23;
  allocator<char> local_c22;
  allocator<char> local_c21;
  allocator<char> local_c20;
  allocator<char> local_c1f;
  allocator<char> local_c1e;
  allocator<char> local_c1d;
  allocator<char> local_c1c;
  allocator<char> local_c1b;
  allocator<char> local_c1a;
  allocator<char> local_c19;
  allocator<char> local_c18;
  allocator<char> local_c17;
  allocator<char> local_c16;
  allocator<char> local_c15;
  allocator<char> local_c14;
  allocator<char> local_c13;
  allocator<char> local_c12;
  allocator<char> local_c11;
  allocator<char> local_c10;
  allocator<char> local_c0f;
  allocator<char> local_c0e;
  allocator<char> local_c0d;
  allocator<char> local_c0c;
  allocator<char> local_c0b;
  allocator<char> local_c0a;
  allocator<char> local_c09;
  allocator<char> local_c08;
  allocator<char> local_c07;
  allocator<char> local_c06;
  allocator<char> local_c05;
  allocator<char> local_c04;
  allocator<char> local_c03;
  allocator<char> local_c02;
  allocator<char> local_c01;
  allocator<char> local_c00;
  allocator<char> local_bff;
  allocator<char> local_bfe;
  allocator<char> local_bfd;
  allocator<char> local_bfc;
  allocator<char> local_bfb;
  allocator<char> local_bfa;
  allocator<char> local_bf9;
  KeyPair keypair_1;
  string local_bd8 [32];
  string local_bb8 [32];
  KeyPair keypair;
  string local_b78 [32];
  string local_b58 [32];
  undefined1 local_b38 [64];
  string local_af8 [32];
  CKey key;
  string local_ab8 [32];
  string local_a98 [32];
  undefined1 local_a78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_a68;
  string local_a58 [32];
  string local_a38 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig_1;
  string local_9f8 [32];
  string local_9d8 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pub;
  string local_998 [32];
  string local_978 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> sec;
  string local_938 [32];
  string local_918 [32];
  undefined1 local_8f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_8e8;
  string local_8d8 [32];
  string local_8b8 [32];
  XOnlyPubKey tweaked_key;
  string local_878 [32];
  string local_858 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig;
  string local_818 [32];
  string local_7f8 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> msg;
  string local_7b8 [32];
  string local_798 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey;
  string local_758 [32];
  string local_738 [32];
  uint256 aux256;
  string local_6f8 [32];
  string local_6d8 [32];
  uchar sig64 [64];
  string local_678 [40];
  optional<std::pair<XOnlyPubKey,_bool>_> tweaked;
  string local_610 [32];
  string local_5f0 [8];
  undefined1 local_5e8 [56];
  string local_5b0 [32];
  string local_590 [8];
  undefined1 local_588;
  undefined1 local_580 [48];
  string local_550 [32];
  string local_530 [16];
  undefined1 local_520;
  undefined1 local_518 [40];
  string local_4f0 [32];
  string local_4d0 [24];
  undefined1 local_4b8;
  undefined1 local_4b0 [64];
  string local_470 [32];
  string local_450 [8];
  undefined1 local_448 [56];
  string local_410 [32];
  string local_3f0 [8];
  undefined1 local_3e8;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  local_3e0;
  undefined1 local_380;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  local_378;
  undefined1 local_318;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  local_310;
  undefined1 local_2b0;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  local_2a8;
  undefined1 local_248;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  local_240;
  undefined1 local_1e0;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  local_1d8;
  undefined1 local_178;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  local_170;
  undefined1 local_110;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  local_108;
  undefined1 local_a8;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  local_a0;
  undefined1 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (test_method()::VECTORS_abi_cxx11_ == '\0') {
    iVar5 = __cxa_guard_acquire(&test_method()::VECTORS_abi_cxx11_);
    if (iVar5 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)sig64,"F9308A019258C31049344F85F89D5229B531C845836F99B08601F113BCE036F9",
                 &local_bf9);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(sig64 + 0x20),
                 "0000000000000000000000000000000000000000000000000000000000000000",&local_bfa);
      std::__cxx11::string::string<std::allocator<char>>
                (local_678,
                 "E907831F80848D1069A5371B402410364BDF1C5F8307B0084C55F1CE2DCA821525F66A4A85EA8B71E482A74F382D2CE5EBEEE8FDB2172F477DF4900D310536C0"
                 ,&local_bfb);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
      array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
             *)&tweaked,
            (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
             *)sig64);
      local_5f0[0] = (string)0x1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&aux256,
                 "DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659",&local_bfc);
      std::__cxx11::string::string<std::allocator<char>>
                (local_6f8,"243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89",
                 &local_bfd);
      std::__cxx11::string::string<std::allocator<char>>
                (local_6d8,
                 "6896BD60EEAE296DB48A229FF71DFE071BDE413E6D43F917DC8DCF8C78DE33418906D11AC976ABCCB20B091292BFF4EA897EFCB639EA871CFA95F6DE339E4B0A"
                 ,&local_bfe);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
      array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
             *)local_5e8,
            (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
             *)&aux256);
      local_588 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&pubkey,
                 "DD308AFEC5777E13121FA72B9CC1B7CC0139715309B086C960E18FD969774EB8",&local_bff);
      std::__cxx11::string::string<std::allocator<char>>
                (local_758,"7E2D58D8B3BCDF1ABADEC7829054F90DDA9805AAB56C77333024B9D0A508B75C",
                 &local_c00);
      std::__cxx11::string::string<std::allocator<char>>
                (local_738,
                 "5831AAEED7B44BB74E5EAB94BA9D4294C49BCF2A60728D8B4C200F50DD313C1BAB745879A5AD954A72C45A91C3A51D3C7ADEA98D82F8481E0E1E03674A6F3FB7"
                 ,&local_c01);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
      array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
             *)local_580,
            (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
             *)&pubkey);
      local_520 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&msg,"25D1DFF95105F5253C4022F628A996AD3A0D95FBF21D468A1B33F8C160D8F517",
                 &local_c02);
      std::__cxx11::string::string<std::allocator<char>>
                (local_7b8,"FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFF",
                 &local_c03);
      std::__cxx11::string::string<std::allocator<char>>
                (local_798,
                 "7EB0509757E246F19449885651611CB965ECC1A187DD51B64FDA1EDC9637D5EC97582B9CB13DB3933705B32BA982AF5AF25FD78881EBB32771FC5922EFC66EA3"
                 ,&local_c04);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
      array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
             *)local_518,
            (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
             *)&msg);
      local_4b8 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sig,"D69C3509BB99E412E68B0FE8544E72837DFA30746D8BE2AA65975F29D22DC7B9",
                 &local_c05);
      std::__cxx11::string::string<std::allocator<char>>
                (local_818,"4DF3C3F68FCC83B27E9D42C90431A72499F17875C81A599B566C9889B9696703",
                 &local_c06);
      std::__cxx11::string::string<std::allocator<char>>
                (local_7f8,
                 "00000000000000000000003B78CE563F89A0ED9414F5AA28AD0D96D6795F9C6376AFB1548AF603B3EB45C9F8207DEE1060CB71C04E80F593060B07D28308D7F4"
                 ,&local_c07);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
      array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
             *)local_4b0,
            (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
             *)&sig);
      local_450[0] = (string)0x1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&tweaked_key,
                 "EEFDEA4CDB677750A420FEE807EACF21EB9898AE79B9768766E4FAA04A2D4A34",&local_c08);
      std::__cxx11::string::string<std::allocator<char>>
                (local_878,"243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89",
                 &local_c09);
      std::__cxx11::string::string<std::allocator<char>>
                (local_858,
                 "6CFF5C3BA86C69EA4B7376F31A9BCB4F74C1976089B2D9963DA2E5543E17776969E89B4C5564D00349106B8497785DD7D1D713A8AE82B32FA79D5F7FC407D39B"
                 ,&local_c0a);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
      array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
             *)local_448,
            (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
             *)&tweaked_key);
      local_3e8 = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_8f8,
                 "DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659",&local_c0b);
      std::__cxx11::string::string<std::allocator<char>>
                (local_8d8,"243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89",
                 &local_c0c);
      std::__cxx11::string::string<std::allocator<char>>
                (local_8b8,
                 "FFF97BD5755EEEA420453A14355235D382F6472F8568A18B2F057A14602975563CC27944640AC607CD107AE10923D9EF7A73C643E166BE5EBEAFA34B1AC553E2"
                 ,&local_c0d);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
      array(&local_3e0,
            (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
             *)local_8f8);
      local_380 = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sec,"DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659",
                 &local_c0e);
      std::__cxx11::string::string<std::allocator<char>>
                (local_938,"243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89",
                 &local_c0f);
      std::__cxx11::string::string<std::allocator<char>>
                (local_918,
                 "1FA62E331EDBC21C394792D2AB1100A7B432B013DF3F6FF4F99FCB33E0E1515F28890B3EDB6E7189B630448B515CE4F8622A954CFE545735AAEA5134FCCDB2BD"
                 ,&local_c10);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
      array(&local_378,
            (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
             *)&sec);
      local_318 = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&pub,"DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659",
                 &local_c11);
      std::__cxx11::string::string<std::allocator<char>>
                (local_998,"243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89",
                 &local_c12);
      std::__cxx11::string::string<std::allocator<char>>
                (local_978,
                 "6CFF5C3BA86C69EA4B7376F31A9BCB4F74C1976089B2D9963DA2E5543E177769961764B3AA9B2FFCB6EF947B6887A226E8D7C93E00C5ED0C1834FF0D0C2E6DA6"
                 ,&local_c13);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
      array(&local_310,
            (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
             *)&pub);
      local_2b0 = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sig_1,"DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659"
                 ,&local_c14);
      std::__cxx11::string::string<std::allocator<char>>
                (local_9f8,"243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89",
                 &local_c15);
      std::__cxx11::string::string<std::allocator<char>>
                (local_9d8,
                 "0000000000000000000000000000000000000000000000000000000000000000123DDA8328AF9C23A94C1FEECFD123BA4FB73476F0D594DCB65C6425BD186051"
                 ,&local_c16);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
      array(&local_2a8,
            (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
             *)&sig_1);
      local_248 = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_a78,
                 "DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659",&local_c17);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_a78 + 0x20),
                 "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89",&local_c18);
      std::__cxx11::string::string<std::allocator<char>>
                (local_a38,
                 "00000000000000000000000000000000000000000000000000000000000000017615FBAF5AE28864013C099742DEADB4DBA87F11AC6754F93780D5A1837CF197"
                 ,&local_c19);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
      array(&local_240,
            (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
             *)local_a78);
      local_1e0 = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&key,"DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659",
                 &local_c1a);
      std::__cxx11::string::string<std::allocator<char>>
                (local_ab8,"243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89",
                 &local_c1b);
      std::__cxx11::string::string<std::allocator<char>>
                (local_a98,
                 "4A298DACAE57395A15D0795DDBFD1DCB564DA82B0F269BC70A74F8220429BA1D69E89B4C5564D00349106B8497785DD7D1D713A8AE82B32FA79D5F7FC407D39B"
                 ,&local_c1c);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
      array(&local_1d8,
            (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
             *)&key);
      local_178 = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_b38,
                 "DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659",&local_c1d);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_b38 + 0x20),
                 "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89",&local_c1e);
      std::__cxx11::string::string<std::allocator<char>>
                (local_af8,
                 "FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFEFFFFFC2F69E89B4C5564D00349106B8497785DD7D1D713A8AE82B32FA79D5F7FC407D39B"
                 ,&local_c1f);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
      array(&local_170,
            (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
             *)local_b38);
      local_110 = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&keypair,
                 "DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659",&local_c20);
      std::__cxx11::string::string<std::allocator<char>>
                (local_b78,"243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89",
                 &local_c21);
      std::__cxx11::string::string<std::allocator<char>>
                (local_b58,
                 "6CFF5C3BA86C69EA4B7376F31A9BCB4F74C1976089B2D9963DA2E5543E177769FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFEBAAEDCE6AF48A03BBFD25E8CD0364141"
                 ,&local_c22);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
      array(&local_108,
            (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
             *)&keypair);
      local_a8 = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&keypair_1,
                 "FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFEFFFFFC30",&local_c23);
      std::__cxx11::string::string<std::allocator<char>>
                (local_bd8,"243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89",
                 &local_c24);
      std::__cxx11::string::string<std::allocator<char>>
                (local_bb8,
                 "6CFF5C3BA86C69EA4B7376F31A9BCB4F74C1976089B2D9963DA2E5543E17776969E89B4C5564D00349106B8497785DD7D1D713A8AE82B32FA79D5F7FC407D39B"
                 ,&local_c25);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
      array(&local_a0,
            (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
             *)&keypair_1);
      local_40 = 0;
      __l._M_len = 0xf;
      __l._M_array = (iterator)&tweaked;
      std::
      vector<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>,_std::allocator<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>_>
      ::vector(&test_method()::VECTORS_abi_cxx11_,__l,&local_c26);
      lVar11 = 0x5b0;
      do {
        std::
        array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
        ::~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                  *)((long)&tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>.
                            _M_payload.super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>.
                            _M_payload + lVar11));
        lVar11 = lVar11 + -0x68;
      } while (lVar11 != -0x68);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
      ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *)&keypair_1);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
      ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *)&keypair);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
      ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *)local_b38);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
      ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *)&key);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
      ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *)local_a78);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
      ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *)&sig_1);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
      ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *)&pub);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
      ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *)&sec);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
      ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *)local_8f8);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
      ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *)&tweaked_key);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
      ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *)&sig);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
      ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *)&msg);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
      ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *)&pubkey);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
      ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *)&aux256);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
      ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *)sig64);
      __cxa_atexit(std::
                   vector<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>,_std::allocator<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>_>
                   ::~vector,&test_method()::VECTORS_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&test_method()::VECTORS_abi_cxx11_);
    }
  }
  ppVar1 = test_method()::VECTORS_abi_cxx11_.
           super__Vector_base<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>,_std::allocator<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar10 = test_method()::VECTORS_abi_cxx11_.
                 super__Vector_base<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>,_std::allocator<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar10 != ppVar1; ppVar10 = ppVar10 + 1
      ) {
    hex_str._M_str = (ppVar10->first)._M_elems[0]._M_dataplus._M_p;
    hex_str._M_len = (ppVar10->first)._M_elems[0]._M_string_length;
    ParseHex<unsigned_char>(&pubkey,hex_str);
    hex_str_00._M_str = (ppVar10->first)._M_elems[1]._M_dataplus._M_p;
    hex_str_00._M_len = (ppVar10->first)._M_elems[1]._M_string_length;
    ParseHex<unsigned_char>(&msg,hex_str_00);
    hex_str_01._M_str = (ppVar10->first)._M_elems[2]._M_dataplus._M_p;
    hex_str_01._M_len = (ppVar10->first)._M_elems[2]._M_string_length;
    ParseHex<unsigned_char>(&sig,hex_str_01);
    local_c38 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_tests.cpp"
    ;
    local_c30 = "";
    local_c48 = &boost::unit_test::basic_cstring<char_const>::null;
    local_c40 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_00.m_end = (iterator)in_R9;
    msg_00.m_begin = in_R8;
    file.m_end = (iterator)0x116;
    file.m_begin = (iterator)&local_c38;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_c48,msg_00
              );
    tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
    super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._M_value.first.m_keydata.
    super_base_blob<256U>.m_data._M_elems[8] = '\0';
    tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
    super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._0_8_ =
         &PTR__lazy_ostream_01139f30;
    tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
    super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
    super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._24_8_ =
         (long)"\x05\x04\x03\x02\x01" + 5;
    local_c58 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_tests.cpp"
    ;
    local_c50 = "";
    vch.m_size = (long)pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
    vch.m_data = pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
    base_blob<256U>::base_blob((base_blob<256U> *)sig64,vch);
    vch_00.m_size =
         (long)msg.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)msg.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    vch_00.m_data =
         msg.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    base_blob<256U>::base_blob(&aux256.super_base_blob<256U>,vch_00);
    sigbytes.m_size =
         (long)sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    sigbytes.m_data =
         sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    bVar3 = XOnlyPubKey::VerifySchnorr
                      ((XOnlyPubKey *)sig64,(uint256 *)&aux256.super_base_blob<256U>,sigbytes);
    tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = bVar3;
    in_stack_fffffffffffff140 = &ppVar10->second;
    in_R8 = (iterator)0x2;
    in_R9 = &tweaked_key;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (&tweaked,&local_c58,0x116,1,2,in_R9,
               "XOnlyPubKey(pubkey).VerifySchnorr(uint256(msg), sig)",in_stack_fffffffffffff140,
               "test.second");
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&msg.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  if (test_method()::SIGN_VECTORS_abi_cxx11_ == '\0') {
    iVar5 = __cxa_guard_acquire(&test_method()::SIGN_VECTORS_abi_cxx11_);
    if (iVar5 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&tweaked,
                 "0000000000000000000000000000000000000000000000000000000000000003",
                 (allocator<char> *)sig64);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
                  super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._M_value.
                  second,"F9308A019258C31049344F85F89D5229B531C845836F99B08601F113BCE036F9",
                 (allocator<char> *)&aux256);
      std::__cxx11::string::string<std::allocator<char>>
                (local_610,"0000000000000000000000000000000000000000000000000000000000000000",
                 (allocator<char> *)&pubkey);
      std::__cxx11::string::string<std::allocator<char>>
                (local_5f0,"0000000000000000000000000000000000000000000000000000000000000000",
                 (allocator<char> *)&msg);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_5e8 + 0x18),
                 "E907831F80848D1069A5371B402410364BDF1C5F8307B0084C55F1CE2DCA821525F66A4A85EA8B71E482A74F382D2CE5EBEEE8FDB2172F477DF4900D310536C0"
                 ,(allocator<char> *)&sig);
      std::__cxx11::string::string<std::allocator<char>>
                (local_5b0,"B7E151628AED2A6ABF7158809CF4F3C762E7160F38B4DA56A784D9045190CFEF",
                 (allocator<char> *)&tweaked_key);
      std::__cxx11::string::string<std::allocator<char>>
                (local_590,"DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659",
                 (allocator<char> *)local_8f8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_580 + 0x10),
                 "0000000000000000000000000000000000000000000000000000000000000001",
                 (allocator<char> *)&sec);
      std::__cxx11::string::string<std::allocator<char>>
                (local_550,"243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89",
                 (allocator<char> *)&pub);
      std::__cxx11::string::string<std::allocator<char>>
                (local_530,
                 "6896BD60EEAE296DB48A229FF71DFE071BDE413E6D43F917DC8DCF8C78DE33418906D11AC976ABCCB20B091292BFF4EA897EFCB639EA871CFA95F6DE339E4B0A"
                 ,(allocator<char> *)&sig_1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_518 + 8),
                 "C90FDAA22168C234C4C6628B80DC1CD129024E088A67CC74020BBEA63B14E5C9",
                 (allocator<char> *)local_a78);
      std::__cxx11::string::string<std::allocator<char>>
                (local_4f0,"DD308AFEC5777E13121FA72B9CC1B7CC0139715309B086C960E18FD969774EB8",
                 (allocator<char> *)&key);
      std::__cxx11::string::string<std::allocator<char>>
                (local_4d0,"C87AA53824B4D7AE2EB035A2B5BBBCCC080E76CDC6D1692C4B0B62D798E6D906",
                 (allocator<char> *)local_b38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_4b0,
                 "7E2D58D8B3BCDF1ABADEC7829054F90DDA9805AAB56C77333024B9D0A508B75C",
                 (allocator<char> *)&keypair);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_4b0 + 0x20),
                 "5831AAEED7B44BB74E5EAB94BA9D4294C49BCF2A60728D8B4C200F50DD313C1BAB745879A5AD954A72C45A91C3A51D3C7ADEA98D82F8481E0E1E03674A6F3FB7"
                 ,(allocator<char> *)&keypair_1);
      std::__cxx11::string::string<std::allocator<char>>
                (local_470,"0B432B2677937381AEF05BB02A66ECD012773062CF3FA2549E44F58ED2401710",
                 &local_bf9);
      std::__cxx11::string::string<std::allocator<char>>
                (local_450,"25D1DFF95105F5253C4022F628A996AD3A0D95FBF21D468A1B33F8C160D8F517",
                 &local_bfa);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_448 + 0x18),
                 "FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFF",&local_bfb);
      std::__cxx11::string::string<std::allocator<char>>
                (local_410,"FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFF",
                 &local_bfc);
      std::__cxx11::string::string<std::allocator<char>>
                (local_3f0,
                 "7EB0509757E246F19449885651611CB965ECC1A187DD51B64FDA1EDC9637D5EC97582B9CB13DB3933705B32BA982AF5AF25FD78881EBB32771FC5922EFC66EA3"
                 ,&local_bfd);
      __l_00._M_len = 4;
      __l_00._M_array = (iterator)&tweaked;
      std::
      vector<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>_>_>
      ::vector(&test_method()::SIGN_VECTORS_abi_cxx11_,__l_00,(allocator_type *)&local_bfe);
      lVar11 = 0x1e0;
      do {
        std::
        array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>
        ::~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>
                  *)((long)&tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>.
                            _M_payload.super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>.
                            _M_payload + lVar11));
        lVar11 = lVar11 + -0xa0;
      } while (lVar11 != -0xa0);
      __cxa_atexit(std::
                   vector<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>_>_>
                   ::~vector,&test_method()::SIGN_VECTORS_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&test_method()::SIGN_VECTORS_abi_cxx11_);
    }
  }
  paVar2 = test_method()::SIGN_VECTORS_abi_cxx11_.
           super__Vector_base<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng;
  for (paVar6 = test_method()::SIGN_VECTORS_abi_cxx11_.
                super__Vector_base<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start; paVar6 != paVar2; paVar6 = paVar6 + 1) {
    hex_str_02._M_str = paVar6->_M_elems[0]._M_dataplus._M_p;
    hex_str_02._M_len = paVar6->_M_elems[0]._M_string_length;
    ParseHex<unsigned_char>(&sec,hex_str_02);
    hex_str_03._M_str = paVar6->_M_elems[1]._M_dataplus._M_p;
    hex_str_03._M_len = paVar6->_M_elems[1]._M_string_length;
    ParseHex<unsigned_char>(&pub,hex_str_03);
    hex_str_04._M_str = paVar6->_M_elems[2]._M_dataplus._M_p;
    hex_str_04._M_len = paVar6->_M_elems[2]._M_string_length;
    ParseHex<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tweaked,hex_str_04);
    vch_01.m_size =
         CONCAT71(tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
                  super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._9_7_,
                  tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
                  super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._M_value.
                  first.m_keydata.super_base_blob<256U>.m_data._M_elems[8]) -
         tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
         super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._0_8_;
    vch_01.m_data =
         (uchar *)tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
                  super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._0_8_;
    base_blob<256U>::base_blob(&aux256.super_base_blob<256U>,vch_01);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweaked);
    hex_str_05._M_str = paVar6->_M_elems[3]._M_dataplus._M_p;
    hex_str_05._M_len = paVar6->_M_elems[3]._M_string_length;
    ParseHex<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tweaked,hex_str_05);
    vch_02.m_size =
         CONCAT71(tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
                  super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._9_7_,
                  tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
                  super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._M_value.
                  first.m_keydata.super_base_blob<256U>.m_data._M_elems[8]) -
         tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
         super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._0_8_;
    vch_02.m_data =
         (uchar *)tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
                  super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._0_8_;
    base_blob<256U>::base_blob((base_blob<256U> *)&pubkey,vch_02);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweaked);
    hex_str_06._M_str = paVar6->_M_elems[4]._M_dataplus._M_p;
    hex_str_06._M_len = paVar6->_M_elems[4]._M_string_length;
    ParseHex<unsigned_char>(&sig_1,hex_str_06);
    key.fCompressed = false;
    key.keydata._M_t.
    super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
         (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
          )(__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
            )0x0;
    CKey::
    Set<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (&key,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     )sec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )sec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,true);
    CKey::GetPubKey((CPubKey *)&tweaked,&key);
    XOnlyPubKey::XOnlyPubKey((XOnlyPubKey *)&msg,(CPubKey *)&tweaked);
    local_c68 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_tests.cpp"
    ;
    local_c60 = "";
    local_c78 = &boost::unit_test::basic_cstring<char_const>::null;
    local_c70 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_01.m_end = (iterator)in_R9;
    msg_01.m_begin = in_R8;
    file_00.m_end = (iterator)0x12c;
    file_00.m_begin = (iterator)&local_c68;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_c78,
               msg_01);
    bVar3 = std::
            __equal4<unsigned_char*,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      ((uchar *)&msg,(uchar *)local_7b8,
                       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )pub.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )pub.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
    sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,bVar3);
    sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_7f5bb6;
    tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems._8_8_ =
         (long)"std::equal(pubkey.begin(), pubkey.end(), pub.begin(), pub.end())" + 0x40;
    tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
    super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._M_value.first.m_keydata.
    super_base_blob<256U>.m_data._M_elems[8] = '\0';
    tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
    super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._0_8_ =
         &PTR__lazy_ostream_0113a070;
    tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
    super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
    super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._24_8_ = &tweaked_key;
    local_c88 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_tests.cpp"
    ;
    local_c80 = "";
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&sig,(lazy_ostream *)&tweaked,1,0,WARN,
               (check_type)in_stack_fffffffffffff140,(size_t)&local_c88,300);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    pvVar8 = (iterator)0x0;
    puVar7 = &aux256;
    sig_00.m_size = 0x40;
    sig_00.m_data = sig64;
    bVar3 = CKey::SignSchnorr(&key,(uint256 *)&pubkey,sig_00,(uint256 *)0x0,puVar7);
    local_c98 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_tests.cpp"
    ;
    local_c90 = "";
    local_ca8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_ca0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_02.m_end = (iterator)puVar7;
    msg_02.m_begin = pvVar8;
    file_01.m_end = (iterator)0x12e;
    file_01.m_begin = (iterator)&local_c98;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_ca8,
               msg_02);
    sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,bVar3);
    sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems._0_8_ =
         (long)"cuckoocache_erase_ok" + 0x12;
    tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems._8_8_ =
         (long)"cuckoocache_erase_ok" + 0x14;
    tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
    super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._M_value.first.m_keydata.
    super_base_blob<256U>.m_data._M_elems[8] = '\0';
    tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
    super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._0_8_ =
         &PTR__lazy_ostream_0113a070;
    tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
    super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
    super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._24_8_ = &tweaked_key;
    local_cb8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_tests.cpp"
    ;
    local_cb0 = "";
    pvVar8 = &DAT_00000001;
    pvVar9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&sig,(lazy_ostream *)&tweaked,1,0,WARN,
               (check_type)in_stack_fffffffffffff140,(size_t)&local_cb8,0x12e);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_cc8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_tests.cpp"
    ;
    local_cc0 = "";
    local_cd8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_cd0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_03.m_end = pvVar9;
    msg_03.m_begin = pvVar8;
    file_02.m_end = (iterator)0x12f;
    file_02.m_begin = (iterator)&local_cc8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_cd8,
               msg_03);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&tweaked_key,sig64,
               (uchar *)local_678,(allocator_type *)local_a78);
    bVar3 = std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tweaked_key,
                            &sig_1);
    sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,bVar3);
    sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_8f8._0_8_ = "std::vector<unsigned char>(sig64, sig64 + 64) == sig";
    local_8f8._8_8_ = "";
    tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
    super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._M_value.first.m_keydata.
    super_base_blob<256U>.m_data._M_elems[8] = '\0';
    tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
    super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._0_8_ =
         &PTR__lazy_ostream_0113a070;
    tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
    super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    local_ce8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_tests.cpp"
    ;
    local_ce0 = "";
    pvVar8 = &DAT_00000001;
    pvVar9 = (iterator)0x0;
    tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
    super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._24_8_ =
         (assertion_result *)local_8f8;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&sig,(lazy_ostream *)&tweaked,1,0,WARN,
               (check_type)in_stack_fffffffffffff140,(size_t)&local_ce8,0x12f);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweaked_key);
    local_cf8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_tests.cpp"
    ;
    local_cf0 = "";
    local_d08 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d00 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_04.m_end = pvVar9;
    msg_04.m_begin = pvVar8;
    file_03.m_end = (iterator)0x131;
    file_03.m_begin = (iterator)&local_cf8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_d08,
               msg_04);
    sigbytes_00.m_size = 0x40;
    sigbytes_00.m_data = sig64;
    bVar3 = XOnlyPubKey::VerifySchnorr((XOnlyPubKey *)&msg,(uint256 *)&pubkey,sigbytes_00);
    sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,bVar3);
    sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_7f5beb;
    tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems._8_8_ =
         (long)"pubkey.VerifySchnorr(msg256, sig64)" + 0x23;
    tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
    super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._M_value.first.m_keydata.
    super_base_blob<256U>.m_data._M_elems[8] = '\0';
    tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
    super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._0_8_ =
         &PTR__lazy_ostream_0113a070;
    tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
    super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
    super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._24_8_ = &tweaked_key;
    local_d18 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_tests.cpp"
    ;
    local_d10 = "";
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&sig,(lazy_ostream *)&tweaked,1,0,WARN,
               (check_type)in_stack_fffffffffffff140,(size_t)&local_d18,0x131);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    CKey::ComputeKeyPair((CKey *)&keypair,(uint256 *)&key);
    puVar7 = &aux256;
    sig_01.m_size = 0x40;
    sig_01.m_data = sig64;
    bVar3 = KeyPair::SignSchnorr(&keypair,(uint256 *)&pubkey,sig_01,puVar7);
    local_d28 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_tests.cpp"
    ;
    local_d20 = "";
    local_d38 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d30 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_05.m_end = pvVar8;
    msg_05.m_begin = (iterator)puVar7;
    file_04.m_end = (iterator)0x136;
    file_04.m_begin = (iterator)&local_d28;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_d38,
               msg_05);
    sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,bVar3);
    sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_7f5bf8;
    tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems._8_8_ = (long)"kp_ok" + 5;
    tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
    super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._M_value.first.m_keydata.
    super_base_blob<256U>.m_data._M_elems[8] = '\0';
    tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
    super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._0_8_ =
         &PTR__lazy_ostream_0113a070;
    tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
    super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
    super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._24_8_ = &tweaked_key;
    local_d48 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_tests.cpp"
    ;
    local_d40 = "";
    pvVar8 = &DAT_00000001;
    pvVar9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&sig,(lazy_ostream *)&tweaked,1,0,WARN,
               (check_type)in_stack_fffffffffffff140,(size_t)&local_d48,0x136);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_d58 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_tests.cpp"
    ;
    local_d50 = "";
    local_d68 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d60 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_06.m_end = pvVar9;
    msg_06.m_begin = pvVar8;
    file_05.m_end = (iterator)0x137;
    file_05.m_begin = (iterator)&local_d58;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_d68,
               msg_06);
    sigbytes_01.m_size = 0x40;
    sigbytes_01.m_data = sig64;
    bVar3 = XOnlyPubKey::VerifySchnorr((XOnlyPubKey *)&msg,(uint256 *)&pubkey,sigbytes_01);
    sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,bVar3);
    sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_7f5beb;
    tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems._8_8_ =
         (long)"pubkey.VerifySchnorr(msg256, sig64)" + 0x23;
    tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
    super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._M_value.first.m_keydata.
    super_base_blob<256U>.m_data._M_elems[8] = '\0';
    tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
    super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._0_8_ =
         &PTR__lazy_ostream_0113a070;
    tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
    super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
    super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._24_8_ = &tweaked_key;
    local_d78 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_tests.cpp"
    ;
    local_d70 = "";
    pvVar8 = &DAT_00000001;
    pvVar9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&sig,(lazy_ostream *)&tweaked,1,0,WARN,
               (check_type)in_stack_fffffffffffff140,(size_t)&local_d78,0x137);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_d88 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_tests.cpp"
    ;
    local_d80 = "";
    local_d98 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d90 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_07.m_end = pvVar9;
    msg_07.m_begin = pvVar8;
    file_06.m_end = (iterator)0x138;
    file_06.m_begin = (iterator)&local_d88;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_d98,
               msg_07);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&tweaked_key,sig64,
               (uchar *)local_678,(allocator_type *)local_a78);
    bVar3 = std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tweaked_key,
                            &sig_1);
    sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,bVar3);
    sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_8f8._0_8_ = "std::vector<unsigned char>(sig64, sig64 + 64) == sig";
    local_8f8._8_8_ = "";
    tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
    super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._M_value.first.m_keydata.
    super_base_blob<256U>.m_data._M_elems[8] = '\0';
    tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
    super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._0_8_ =
         &PTR__lazy_ostream_0113a070;
    tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
    super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    local_da8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_tests.cpp"
    ;
    local_da0 = "";
    in_R8 = &DAT_00000001;
    in_R9 = (XOnlyPubKey *)0x0;
    tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
    super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._24_8_ =
         (assertion_result *)local_8f8;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&sig,(lazy_ostream *)&tweaked,1,0,WARN,
               (check_type)in_stack_fffffffffffff140,(size_t)&local_da8,0x138);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweaked_key);
    iVar5 = 10;
    while( true ) {
      if (iVar5 == 0) break;
      sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if (iVar5 == 10) {
        puVar7 = (uint256 *)0x0;
      }
      else {
        RandomMixin<FastRandomContext>::rand256
                  ((uint256 *)&tweaked,&this_00->super_RandomMixin<FastRandomContext>);
        sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)CONCAT71(tweaked.
                               super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>.
                               _M_payload.
                               super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>.
                               _M_payload._9_7_,
                               tweaked.
                               super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>.
                               _M_payload.
                               super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>.
                               _M_payload._M_value.first.m_keydata.super_base_blob<256U>.m_data.
                               _M_elems[8]);
        sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>.
                      _M_payload.super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>.
                      _M_payload._16_8_;
        sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>.
                      _M_payload.super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>.
                      _M_payload._0_8_;
        puVar7 = (uint256 *)&sig;
      }
      XOnlyPubKey::CreateTapTweak(&tweaked,(XOnlyPubKey *)&msg,puVar7);
      local_db8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_tests.cpp"
      ;
      local_db0 = "";
      local_dc8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_dc0 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_08.m_end = (iterator)in_R9;
      msg_08.m_begin = in_R8;
      file_07.m_end = (iterator)0x141;
      file_07.m_begin = (iterator)&local_db8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_dc8,
                 msg_08);
      local_8f8[0] = tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>.
                     _M_payload.super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>.
                     _M_engaged;
      local_8f8._8_8_ = (element_type *)0x0;
      aStack_8e8._M_allocated_capacity = 0;
      local_a78._0_8_ = "tweaked";
      local_a78._8_8_ = "";
      tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems._8_8_ =
           tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
      tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems._0_8_ =
           &PTR__lazy_ostream_0113a070;
      tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems._16_8_ =
           boost::unit_test::lazy_ostream::inst;
      tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems._24_8_ = local_a78;
      local_dd8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_tests.cpp"
      ;
      local_dd0 = "";
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_8f8,(lazy_ostream *)&tweaked_key,1,0,WARN,
                 (check_type)in_stack_fffffffffffff140,(size_t)&local_dd8,0x141);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_8e8._M_allocated_capacity);
      tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems._9_7_ =
           tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
           super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._9_7_;
      tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems[8] =
           tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
           super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._M_value.first.
           m_keydata.super_base_blob<256U>.m_data._M_elems[8];
      tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] =
           tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
           super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._16_1_;
      tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] =
           tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
           super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._17_1_;
      tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] =
           tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
           super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._18_1_;
      tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] =
           tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
           super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._19_1_;
      tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] =
           tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
           super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._20_1_;
      tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] =
           tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
           super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._21_1_;
      tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] =
           tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
           super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._22_1_;
      tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] =
           tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
           super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._23_1_;
      tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] =
           tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
           super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._24_1_;
      tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] =
           tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
           super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._25_1_;
      tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] =
           tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
           super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._26_1_;
      tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] =
           tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
           super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._27_1_;
      tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] =
           tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
           super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._28_1_;
      tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] =
           tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
           super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._29_1_;
      tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] =
           tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
           super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._30_1_;
      tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] =
           tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
           super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._31_1_;
      tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0] =
           tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
           super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._0_1_;
      tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems[1] =
           tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
           super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._1_1_;
      tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems[2] =
           tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
           super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._2_1_;
      tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems[3] =
           tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
           super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._3_1_;
      tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems[4] =
           tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
           super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._4_1_;
      tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems[5] =
           tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
           super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._5_1_;
      tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems[6] =
           tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
           super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._6_1_;
      tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems[7] =
           tweaked.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
           super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_payload._7_1_;
      RandomMixin<FastRandomContext>::rand256
                ((uint256 *)local_8f8,&this_00->super_RandomMixin<FastRandomContext>);
      aux256.super_base_blob<256U>.m_data._M_elems[0x10] = aStack_8e8._M_local_buf[0];
      aux256.super_base_blob<256U>.m_data._M_elems[0x11] = aStack_8e8._M_local_buf[1];
      aux256.super_base_blob<256U>.m_data._M_elems[0x12] = aStack_8e8._M_local_buf[2];
      aux256.super_base_blob<256U>.m_data._M_elems[0x13] = aStack_8e8._M_local_buf[3];
      aux256.super_base_blob<256U>.m_data._M_elems[0x14] = aStack_8e8._M_local_buf[4];
      aux256.super_base_blob<256U>.m_data._M_elems[0x15] = aStack_8e8._M_local_buf[5];
      aux256.super_base_blob<256U>.m_data._M_elems[0x16] = aStack_8e8._M_local_buf[6];
      aux256.super_base_blob<256U>.m_data._M_elems[0x17] = aStack_8e8._M_local_buf[7];
      aux256.super_base_blob<256U>.m_data._M_elems[0x18] = aStack_8e8._M_local_buf[8];
      aux256.super_base_blob<256U>.m_data._M_elems[0x19] = aStack_8e8._M_local_buf[9];
      aux256.super_base_blob<256U>.m_data._M_elems[0x1a] = aStack_8e8._M_local_buf[10];
      aux256.super_base_blob<256U>.m_data._M_elems[0x1b] = aStack_8e8._M_local_buf[0xb];
      aux256.super_base_blob<256U>.m_data._M_elems[0x1c] = aStack_8e8._M_local_buf[0xc];
      aux256.super_base_blob<256U>.m_data._M_elems[0x1d] = aStack_8e8._M_local_buf[0xd];
      aux256.super_base_blob<256U>.m_data._M_elems[0x1e] = aStack_8e8._M_local_buf[0xe];
      aux256.super_base_blob<256U>.m_data._M_elems[0x1f] = aStack_8e8._M_local_buf[0xf];
      aux256.super_base_blob<256U>.m_data._M_elems[0] = local_8f8[0];
      aux256.super_base_blob<256U>.m_data._M_elems[1] = local_8f8[1];
      aux256.super_base_blob<256U>.m_data._M_elems[2] = local_8f8[2];
      aux256.super_base_blob<256U>.m_data._M_elems[3] = local_8f8[3];
      aux256.super_base_blob<256U>.m_data._M_elems[4] = local_8f8[4];
      aux256.super_base_blob<256U>.m_data._M_elems[5] = local_8f8[5];
      aux256.super_base_blob<256U>.m_data._M_elems[6] = local_8f8[6];
      aux256.super_base_blob<256U>.m_data._M_elems[7] = local_8f8[7];
      aux256.super_base_blob<256U>.m_data._M_elems[8] = local_8f8[8];
      aux256.super_base_blob<256U>.m_data._M_elems[9] = local_8f8[9];
      aux256.super_base_blob<256U>.m_data._M_elems[10] = local_8f8[10];
      aux256.super_base_blob<256U>.m_data._M_elems[0xb] = local_8f8[0xb];
      aux256.super_base_blob<256U>.m_data._M_elems[0xc] = local_8f8[0xc];
      aux256.super_base_blob<256U>.m_data._M_elems[0xd] = local_8f8[0xd];
      aux256.super_base_blob<256U>.m_data._M_elems[0xe] = local_8f8[0xe];
      aux256.super_base_blob<256U>.m_data._M_elems[0xf] = local_8f8[0xf];
      puVar7 = (uint256 *)&sig;
      aux = &aux256;
      sig_02.m_size = 0x40;
      sig_02.m_data = sig64;
      rVar4.super_class_property<bool>.value =
           (class_property<bool>)CKey::SignSchnorr(&key,(uint256 *)&pubkey,sig_02,puVar7,aux);
      local_de8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_tests.cpp"
      ;
      local_de0 = "";
      local_df8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_df0 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_09.m_end = (iterator)aux;
      msg_09.m_begin = (iterator)puVar7;
      file_08.m_end = (iterator)0x145;
      file_08.m_begin = (iterator)&local_de8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_df8,
                 msg_09);
      local_a78._8_8_ = (element_type *)0x0;
      aStack_a68._M_allocated_capacity = 0;
      local_b38._0_8_ = "ok";
      local_b38._8_8_ = "";
      local_8f8._8_8_ = local_8f8._8_8_ & 0xffffffffffffff00;
      local_8f8._0_8_ = &PTR__lazy_ostream_0113a070;
      aStack_8e8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      aStack_8e8._8_8_ = local_b38;
      local_e08 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_tests.cpp"
      ;
      local_e00 = "";
      pvVar8 = &DAT_00000001;
      pvVar9 = (iterator)0x0;
      local_a78[0] = rVar4.super_class_property<bool>.value;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_a78,(lazy_ostream *)local_8f8,1,0,WARN,
                 (check_type)in_stack_fffffffffffff140,(size_t)&local_e08,0x145);
      boost::detail::shared_count::~shared_count((shared_count *)(local_a78 + 0x10));
      local_e18 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_tests.cpp"
      ;
      local_e10 = "";
      local_e28 = &boost::unit_test::basic_cstring<char_const>::null;
      local_e20 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_10.m_end = pvVar9;
      msg_10.m_begin = pvVar8;
      file_09.m_end = (iterator)0x146;
      file_09.m_begin = (iterator)&local_e18;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_e28,
                 msg_10);
      sigbytes_02.m_size = 0x40;
      sigbytes_02.m_data = sig64;
      local_a78[0] = (class_property<bool>)
                     XOnlyPubKey::VerifySchnorr(&tweaked_key,(uint256 *)&pubkey,sigbytes_02);
      local_a78._8_8_ = (element_type *)0x0;
      aStack_a68._M_allocated_capacity = 0;
      local_b38._0_8_ = "tweaked_key.VerifySchnorr(msg256, sig64)";
      local_b38._8_8_ = "";
      local_8f8._8_8_ = local_8f8._8_8_ & 0xffffffffffffff00;
      local_8f8._0_8_ = &PTR__lazy_ostream_0113a070;
      aStack_8e8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      aStack_8e8._8_8_ = local_b38;
      local_e38 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_tests.cpp"
      ;
      local_e30 = "";
      pvVar8 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_a78,(lazy_ostream *)local_8f8,1,0,WARN,
                 (check_type)in_stack_fffffffffffff140,(size_t)&local_e38,0x146);
      boost::detail::shared_count::~shared_count((shared_count *)(local_a78 + 0x10));
      CKey::ComputeKeyPair((CKey *)&keypair_1,(uint256 *)&key);
      puVar7 = &aux256;
      sig_03.m_size = 0x40;
      sig_03.m_data = sig64;
      rVar4.super_class_property<bool>.value =
           (class_property<bool>)KeyPair::SignSchnorr(&keypair_1,(uint256 *)&pubkey,sig_03,puVar7);
      local_e48 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_tests.cpp"
      ;
      local_e40 = "";
      local_e58 = &boost::unit_test::basic_cstring<char_const>::null;
      local_e50 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_11.m_end = pvVar8;
      msg_11.m_begin = (iterator)puVar7;
      file_10.m_end = (iterator)0x14b;
      file_10.m_begin = (iterator)&local_e48;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_e58,
                 msg_11);
      local_a78._8_8_ = (element_type *)0x0;
      aStack_a68._M_allocated_capacity = 0;
      local_b38._0_8_ = "kp_ok";
      local_b38._8_8_ = "";
      local_8f8._8_8_ = local_8f8._8_8_ & 0xffffffffffffff00;
      local_8f8._0_8_ = &PTR__lazy_ostream_0113a070;
      aStack_8e8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      aStack_8e8._8_8_ = local_b38;
      local_e68 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_tests.cpp"
      ;
      local_e60 = "";
      pvVar8 = &DAT_00000001;
      pvVar9 = (iterator)0x0;
      local_a78[0] = rVar4.super_class_property<bool>.value;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_a78,(lazy_ostream *)local_8f8,1,0,WARN,
                 (check_type)in_stack_fffffffffffff140,(size_t)&local_e68,0x14b);
      boost::detail::shared_count::~shared_count((shared_count *)(local_a78 + 0x10));
      local_e78 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_tests.cpp"
      ;
      local_e70 = "";
      local_e88 = &boost::unit_test::basic_cstring<char_const>::null;
      local_e80 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_12.m_end = pvVar9;
      msg_12.m_begin = pvVar8;
      file_11.m_end = (iterator)0x14c;
      file_11.m_begin = (iterator)&local_e78;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_e88,
                 msg_12);
      sigbytes_03.m_size = 0x40;
      sigbytes_03.m_data = sig64;
      local_a78[0] = (class_property<bool>)
                     XOnlyPubKey::VerifySchnorr(&tweaked_key,(uint256 *)&pubkey,sigbytes_03);
      local_a78._8_8_ = (element_type *)0x0;
      aStack_a68._M_allocated_capacity = 0;
      local_b38._0_8_ = "tweaked_key.VerifySchnorr(msg256, sig64)";
      local_b38._8_8_ = "";
      local_8f8._8_8_ = local_8f8._8_8_ & 0xffffffffffffff00;
      local_8f8._0_8_ = &PTR__lazy_ostream_0113a070;
      aStack_8e8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      aStack_8e8._8_8_ = local_b38;
      local_e98 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_tests.cpp"
      ;
      local_e90 = "";
      in_R8 = &DAT_00000001;
      in_R9 = (XOnlyPubKey *)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_a78,(lazy_ostream *)local_8f8,1,0,WARN,
                 (check_type)in_stack_fffffffffffff140,(size_t)&local_e98,0x14c);
      boost::detail::shared_count::~shared_count((shared_count *)(local_a78 + 0x10));
      std::
      unique_ptr<std::array<unsigned_char,_96UL>,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>_>
      ::~unique_ptr(&keypair_1.m_keypair);
      iVar5 = iVar5 + -1;
    }
    std::
    unique_ptr<std::array<unsigned_char,_96UL>,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>_>
    ::~unique_ptr(&keypair.m_keypair);
    std::
    unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ::~unique_ptr(&key.keydata);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&sig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&pub.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&sec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(bip340_test_vectors)
{
    static const std::vector<std::pair<std::array<std::string, 3>, bool>> VECTORS = {
        {{"F9308A019258C31049344F85F89D5229B531C845836F99B08601F113BCE036F9", "0000000000000000000000000000000000000000000000000000000000000000", "E907831F80848D1069A5371B402410364BDF1C5F8307B0084C55F1CE2DCA821525F66A4A85EA8B71E482A74F382D2CE5EBEEE8FDB2172F477DF4900D310536C0"}, true},
        {{"DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659", "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89", "6896BD60EEAE296DB48A229FF71DFE071BDE413E6D43F917DC8DCF8C78DE33418906D11AC976ABCCB20B091292BFF4EA897EFCB639EA871CFA95F6DE339E4B0A"}, true},
        {{"DD308AFEC5777E13121FA72B9CC1B7CC0139715309B086C960E18FD969774EB8", "7E2D58D8B3BCDF1ABADEC7829054F90DDA9805AAB56C77333024B9D0A508B75C", "5831AAEED7B44BB74E5EAB94BA9D4294C49BCF2A60728D8B4C200F50DD313C1BAB745879A5AD954A72C45A91C3A51D3C7ADEA98D82F8481E0E1E03674A6F3FB7"}, true},
        {{"25D1DFF95105F5253C4022F628A996AD3A0D95FBF21D468A1B33F8C160D8F517", "FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFF", "7EB0509757E246F19449885651611CB965ECC1A187DD51B64FDA1EDC9637D5EC97582B9CB13DB3933705B32BA982AF5AF25FD78881EBB32771FC5922EFC66EA3"}, true},
        {{"D69C3509BB99E412E68B0FE8544E72837DFA30746D8BE2AA65975F29D22DC7B9", "4DF3C3F68FCC83B27E9D42C90431A72499F17875C81A599B566C9889B9696703", "00000000000000000000003B78CE563F89A0ED9414F5AA28AD0D96D6795F9C6376AFB1548AF603B3EB45C9F8207DEE1060CB71C04E80F593060B07D28308D7F4"}, true},
        {{"EEFDEA4CDB677750A420FEE807EACF21EB9898AE79B9768766E4FAA04A2D4A34", "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89", "6CFF5C3BA86C69EA4B7376F31A9BCB4F74C1976089B2D9963DA2E5543E17776969E89B4C5564D00349106B8497785DD7D1D713A8AE82B32FA79D5F7FC407D39B"}, false},
        {{"DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659", "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89", "FFF97BD5755EEEA420453A14355235D382F6472F8568A18B2F057A14602975563CC27944640AC607CD107AE10923D9EF7A73C643E166BE5EBEAFA34B1AC553E2"}, false},
        {{"DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659", "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89", "1FA62E331EDBC21C394792D2AB1100A7B432B013DF3F6FF4F99FCB33E0E1515F28890B3EDB6E7189B630448B515CE4F8622A954CFE545735AAEA5134FCCDB2BD"}, false},
        {{"DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659", "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89", "6CFF5C3BA86C69EA4B7376F31A9BCB4F74C1976089B2D9963DA2E5543E177769961764B3AA9B2FFCB6EF947B6887A226E8D7C93E00C5ED0C1834FF0D0C2E6DA6"}, false},
        {{"DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659", "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89", "0000000000000000000000000000000000000000000000000000000000000000123DDA8328AF9C23A94C1FEECFD123BA4FB73476F0D594DCB65C6425BD186051"}, false},
        {{"DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659", "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89", "00000000000000000000000000000000000000000000000000000000000000017615FBAF5AE28864013C099742DEADB4DBA87F11AC6754F93780D5A1837CF197"}, false},
        {{"DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659", "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89", "4A298DACAE57395A15D0795DDBFD1DCB564DA82B0F269BC70A74F8220429BA1D69E89B4C5564D00349106B8497785DD7D1D713A8AE82B32FA79D5F7FC407D39B"}, false},
        {{"DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659", "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89", "FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFEFFFFFC2F69E89B4C5564D00349106B8497785DD7D1D713A8AE82B32FA79D5F7FC407D39B"}, false},
        {{"DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659", "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89", "6CFF5C3BA86C69EA4B7376F31A9BCB4F74C1976089B2D9963DA2E5543E177769FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFEBAAEDCE6AF48A03BBFD25E8CD0364141"}, false},
        {{"FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFEFFFFFC30", "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89", "6CFF5C3BA86C69EA4B7376F31A9BCB4F74C1976089B2D9963DA2E5543E17776969E89B4C5564D00349106B8497785DD7D1D713A8AE82B32FA79D5F7FC407D39B"}, false}
    };

    for (const auto& test : VECTORS) {
        auto pubkey = ParseHex(test.first[0]);
        auto msg = ParseHex(test.first[1]);
        auto sig = ParseHex(test.first[2]);
        BOOST_CHECK_EQUAL(XOnlyPubKey(pubkey).VerifySchnorr(uint256(msg), sig), test.second);
    }

    static const std::vector<std::array<std::string, 5>> SIGN_VECTORS = {
        {{"0000000000000000000000000000000000000000000000000000000000000003", "F9308A019258C31049344F85F89D5229B531C845836F99B08601F113BCE036F9", "0000000000000000000000000000000000000000000000000000000000000000", "0000000000000000000000000000000000000000000000000000000000000000", "E907831F80848D1069A5371B402410364BDF1C5F8307B0084C55F1CE2DCA821525F66A4A85EA8B71E482A74F382D2CE5EBEEE8FDB2172F477DF4900D310536C0"}},
        {{"B7E151628AED2A6ABF7158809CF4F3C762E7160F38B4DA56A784D9045190CFEF", "DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659", "0000000000000000000000000000000000000000000000000000000000000001", "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89", "6896BD60EEAE296DB48A229FF71DFE071BDE413E6D43F917DC8DCF8C78DE33418906D11AC976ABCCB20B091292BFF4EA897EFCB639EA871CFA95F6DE339E4B0A"}},
        {{"C90FDAA22168C234C4C6628B80DC1CD129024E088A67CC74020BBEA63B14E5C9", "DD308AFEC5777E13121FA72B9CC1B7CC0139715309B086C960E18FD969774EB8", "C87AA53824B4D7AE2EB035A2B5BBBCCC080E76CDC6D1692C4B0B62D798E6D906", "7E2D58D8B3BCDF1ABADEC7829054F90DDA9805AAB56C77333024B9D0A508B75C", "5831AAEED7B44BB74E5EAB94BA9D4294C49BCF2A60728D8B4C200F50DD313C1BAB745879A5AD954A72C45A91C3A51D3C7ADEA98D82F8481E0E1E03674A6F3FB7"}},
        {{"0B432B2677937381AEF05BB02A66ECD012773062CF3FA2549E44F58ED2401710", "25D1DFF95105F5253C4022F628A996AD3A0D95FBF21D468A1B33F8C160D8F517", "FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFF", "FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFF", "7EB0509757E246F19449885651611CB965ECC1A187DD51B64FDA1EDC9637D5EC97582B9CB13DB3933705B32BA982AF5AF25FD78881EBB32771FC5922EFC66EA3"}},
    };

    for (const auto& [sec_hex, pub_hex, aux_hex, msg_hex, sig_hex] : SIGN_VECTORS) {
        auto sec = ParseHex(sec_hex);
        auto pub = ParseHex(pub_hex);
        uint256 aux256(ParseHex(aux_hex));
        uint256 msg256(ParseHex(msg_hex));
        auto sig = ParseHex(sig_hex);
        unsigned char sig64[64];

        // Run the untweaked test vectors above, comparing with exact expected signature.
        CKey key;
        key.Set(sec.begin(), sec.end(), true);
        XOnlyPubKey pubkey(key.GetPubKey());
        BOOST_CHECK(std::equal(pubkey.begin(), pubkey.end(), pub.begin(), pub.end()));
        bool ok = key.SignSchnorr(msg256, sig64, nullptr, aux256);
        BOOST_CHECK(ok);
        BOOST_CHECK(std::vector<unsigned char>(sig64, sig64 + 64) == sig);
        // Verify those signatures for good measure.
        BOOST_CHECK(pubkey.VerifySchnorr(msg256, sig64));

        // Repeat the same check, but use the KeyPair directly without any merkle tweak
        KeyPair keypair = key.ComputeKeyPair(/*merkle_root=*/nullptr);
        bool kp_ok = keypair.SignSchnorr(msg256, sig64, aux256);
        BOOST_CHECK(kp_ok);
        BOOST_CHECK(pubkey.VerifySchnorr(msg256, sig64));
        BOOST_CHECK(std::vector<unsigned char>(sig64, sig64 + 64) == sig);

        // Do 10 iterations where we sign with a random Merkle root to tweak,
        // and compare against the resulting tweaked keys, with random aux.
        // In iteration i=0 we tweak with empty Merkle tree.
        for (int i = 0; i < 10; ++i) {
            uint256 merkle_root;
            if (i) merkle_root = m_rng.rand256();
            auto tweaked = pubkey.CreateTapTweak(i ? &merkle_root : nullptr);
            BOOST_CHECK(tweaked);
            XOnlyPubKey tweaked_key = tweaked->first;
            aux256 = m_rng.rand256();
            bool ok = key.SignSchnorr(msg256, sig64, &merkle_root, aux256);
            BOOST_CHECK(ok);
            BOOST_CHECK(tweaked_key.VerifySchnorr(msg256, sig64));

            // Repeat the same check, but use the KeyPair class directly
            KeyPair keypair = key.ComputeKeyPair(&merkle_root);
            bool kp_ok = keypair.SignSchnorr(msg256, sig64, aux256);
            BOOST_CHECK(kp_ok);
            BOOST_CHECK(tweaked_key.VerifySchnorr(msg256, sig64));
        }
    }
}